

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

void __thiscall Liby::http::ReplyParser::parse(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  mapped_type *__str;
  char *local_a0;
  char *local_90;
  allocator local_59;
  key_type local_58;
  int local_38;
  char local_34 [4];
  int len;
  char *finish;
  char *pcStack_20;
  bool flag;
  char *end_local;
  char *begin_local;
  ReplyParser *this_local;
  
  _len = (char *)0x0;
  pcStack_20 = end;
  end_local = begin;
  begin_local = (char *)this;
  switch(this->progress_) {
  case 0:
    this->progress_ = 1;
  case 1:
    local_34[3] = 0x20;
    _len = std::find<char_const*,char>(begin,end,local_34 + 3);
    if ((_len != (char *)0x0) &&
       (finish._7_1_ = ParseHttpVersion(this,end_local,_len), (bool)finish._7_1_)) {
      _len = _len + 1;
      this->bytes_ = this->bytes_ + ((int)_len - (int)end_local);
      end_local = _len;
switchD_00151f86_caseD_2:
      local_34[2] = 0x20;
      _len = std::find<char_const*,char>(end_local,pcStack_20,local_34 + 2);
      if ((_len != (char *)0x0) &&
         (finish._7_1_ = ParseStatus(this,end_local,_len), (bool)finish._7_1_)) {
        _len = _len + 1;
        this->bytes_ = this->bytes_ + ((int)_len - (int)end_local);
        end_local = _len;
switchD_00151f86_caseD_3:
        local_34[1] = 10;
        _len = std::find<char_const*,char>(end_local,pcStack_20,local_34 + 1);
        if (_len != (char *)0x0) {
          local_90 = _len;
          if (_len[-1] == '\r') {
            local_90 = _len + -1;
          }
          finish._7_1_ = ParseStatusString(this,end_local,local_90);
          if ((bool)finish._7_1_) {
            _len = _len + 1;
            this->bytes_ = this->bytes_ + ((int)_len - (int)end_local);
            end_local = _len;
switchD_00151f86_caseD_4:
            while (end_local != pcStack_20) {
              local_34[0] = '\n';
              _len = std::find<char_const*,char>(end_local,pcStack_20,local_34);
              if (_len == (char *)0x0) {
                return;
              }
              if ((end_local == _len) || (end_local + 1 == _len)) {
                this->progress_ = 5;
                _len = _len + 1;
                this->bytes_ = this->bytes_ + ((int)_len - (int)end_local);
                end_local = _len;
                break;
              }
              local_a0 = _len;
              if (_len[-1] == '\r') {
                local_a0 = _len + -1;
              }
              finish._7_1_ = ParseHeader(this,end_local,local_a0);
              if (!(bool)finish._7_1_) {
                return;
              }
              _len = _len + 1;
              this->bytes_ = this->bytes_ + ((int)_len - (int)end_local);
              end_local = _len;
            }
switchD_00151f86_caseD_5:
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_58,"Content-Length",&local_59);
            __str = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&(this->super_Reply).headers_,&local_58);
            iVar1 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&local_58);
            std::allocator<char>::~allocator((allocator<char> *)&local_59);
            if (iVar1 == 0) {
              this->progress_ = 6;
            }
            else if (((long)iVar1 <= (long)pcStack_20 - (long)end_local) &&
                    ((long)iVar1 <= (long)pcStack_20 - (long)end_local)) {
              this->progress_ = 6;
              this->bytes_ = iVar1 + this->bytes_;
              local_38 = iVar1;
              Buffer::append(&(this->super_Reply).content_,end_local,(long)iVar1);
            }
          }
        }
      }
    }
    break;
  case 2:
    goto switchD_00151f86_caseD_2;
  case 3:
    goto switchD_00151f86_caseD_3;
  case 4:
    goto switchD_00151f86_caseD_4;
  case 5:
    goto switchD_00151f86_caseD_5;
  case 6:
  }
  return;
}

Assistant:

void ReplyParser::parse(const char *begin, const char *end) {
    bool flag;
    const char *finish = nullptr;
    switch (progress_) {
    default:
        break;
    case Good:
        break;
    case ParseStarting:
        progress_ = ParsingVersion;
    case ParsingVersion:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseHttpVersion(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatus:
        finish = std::find(begin, end, ' ');
        if (finish == nullptr)
            return;
        flag = ParseStatus(begin, finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingStatusString:
        finish = std::find(begin, end, '\n');
        if (finish == nullptr)
            return;
        flag = ParseStatusString(begin,
                                 *(finish - 1) == '\r' ? finish - 1 : finish);
        if (flag == false)
            return;
        bytes_ += ++finish - begin;
        begin = finish;
    case ParsingHeaders: {
        while (begin != end) {
            finish = std::find(begin, end, '\n');
            if (finish == nullptr)
                return;
            if (begin == finish || begin + 1 == finish) {
                progress_ = ParsingBody;
                bytes_ += ++finish - begin;
                begin = finish;
                break;
            }
            flag =
                ParseHeader(begin, *(finish - 1) == '\r' ? finish - 1 : finish);
            if (flag == false)
                return;
            bytes_ += ++finish - begin;
            begin = finish;
        }
    }
    case ParsingBody: {
        int len = std::stoi(headers_["Content-Length"]);
        if (len == 0) {
            progress_ = Good;
            return;
        } else if (end - begin < len) {
            return;
        } else if (end - begin >= len) {
            progress_ = Good;
            bytes_ += len;
            content_.append(begin, len);
            return;
        }
    }
    }
}